

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_tiled_generic_rgb64(int count,QT_FT_Span *spans,void *userData)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int priority;
  int *piVar4;
  undefined8 uVar5;
  uchar *puVar6;
  QThreadPool *pQVar7;
  ulong uVar8;
  long *in_RDX;
  int *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  int cn;
  int i_2;
  int c;
  QThreadPool *threadPool;
  int segments;
  int i_1;
  quint64 *dest_1;
  int i;
  uint *dest;
  QRgba64 *src_1;
  QRgba64 *src;
  int l;
  int sy;
  int sx;
  int y;
  int x;
  bool isBpp64;
  bool isBpp32;
  int yoff;
  int xoff;
  int image_height;
  QSpanData *data;
  QSemaphore semaphore;
  anon_class_40_7_bfeee2df function;
  int sl;
  int length;
  int image_width;
  Operator op;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QRgba64 src_buffer [2048];
  QLoggingCategory *in_stack_ffffffffffffbe28;
  undefined4 in_stack_ffffffffffffbe30;
  int in_stack_ffffffffffffbe34;
  undefined4 in_stack_ffffffffffffbe38;
  int iVar9;
  undefined4 in_stack_ffffffffffffbe3c;
  int iVar10;
  QMessageLogger *in_stack_ffffffffffffbe40;
  QThreadPool *this;
  int local_41b4;
  undefined8 in_stack_ffffffffffffbe50;
  int in_stack_ffffffffffffbe58;
  int in_stack_ffffffffffffbe5c;
  QSpanData *in_stack_ffffffffffffbe60;
  void *in_stack_ffffffffffffbe68;
  QT_FT_Span *in_stack_ffffffffffffbe70;
  int in_stack_ffffffffffffbe7c;
  int local_4180;
  int local_417c;
  int local_4174;
  int local_416c;
  int local_4168;
  int *local_4150;
  int local_4144;
  undefined1 *local_4128;
  undefined1 *local_4120 [2];
  int local_4110;
  int local_410c;
  int local_4108;
  int local_4104;
  int local_40f8;
  int local_40f4;
  int local_40f0;
  int local_40ec;
  char local_40e8 [32];
  undefined1 local_40c8 [48];
  code *local_4098;
  code *local_4090;
  code *local_4088;
  long local_4078;
  undefined1 *local_4018;
  undefined1 *local_4010;
  undefined1 local_4008 [16384];
  long local_8;
  
  iVar10 = (int)((ulong)in_stack_ffffffffffffbe50 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_40c8,&DAT_00bfdc80,0xb0);
  getOperator(in_stack_ffffffffffffbe60,
              (QT_FT_Span *)CONCAT44(in_stack_ffffffffffffbe5c,in_stack_ffffffffffffbe58),iVar10);
  if (local_4078 == 0) {
    local_4018 = &DAT_aaaaaaaaaaaaaaaa;
    local_4010 = &DAT_aaaaaaaaaaaaaaaa;
    lcQtGuiDrawHelper();
    anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_ffffffffffffbe34,in_stack_ffffffffffffbe30),
               in_stack_ffffffffffffbe28);
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_4018), bVar2) {
      anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xb740ac);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffbe40,
                 (char *)CONCAT44(in_stack_ffffffffffffbe3c,in_stack_ffffffffffffbe38),
                 in_stack_ffffffffffffbe34,(char *)in_stack_ffffffffffffbe28,(char *)0xb740c5);
      QMessageLogger::debug
                (local_40e8,
                 "blend_tiled_generic_rgb64: unsupported 64-bit blend attempted, falling back to 32-bit"
                );
      local_4010 = (undefined1 *)((ulong)local_4010 & 0xffffffffffffff00);
    }
    blend_tiled_generic(in_stack_ffffffffffffbe7c,in_stack_ffffffffffffbe70,
                        in_stack_ffffffffffffbe68);
  }
  else {
    local_40ec = (int)in_RDX[0x16];
    iVar10 = *(int *)((long)in_RDX + 0xb4);
    iVar3 = qRound(5.93363206375243e-317);
    local_4168 = -iVar3 % local_40ec;
    iVar3 = qRound(5.9336597314286e-317);
    local_416c = -iVar3 % iVar10;
    if (local_4168 < 0) {
      local_4168 = local_40ec + local_4168;
    }
    if (local_416c < 0) {
      local_416c = iVar10 + local_416c;
    }
    bVar2 = qPixelLayouts[*(uint *)(*in_RDX + 0x10)].bpp != BPP32;
    if (((local_4098 != destFetch64Undefined) || (0x800 < local_40ec)) ||
       ((local_4150 = in_RSI, local_4144 = in_EDI, bVar2 &&
        (qPixelLayouts[*(uint *)(*in_RDX + 0x10)].bpp != BPP64)))) {
      memset(local_4120,0xaa,0x28);
      local_4120[0] = local_40c8;
      local_4110 = local_4168;
      local_410c = local_40ec;
      local_4108 = local_416c;
      iVar3 = (in_EDI + 0x20) / 0x40;
      local_4104 = iVar10;
      pQVar7 = QGuiApplicationPrivate::qtGuiThreadPool();
      if (((1 < iVar3) && (2 < (int)qPixelLayouts[*(uint *)(*in_RDX + 0x10)].bpp)) &&
         (pQVar7 != (QThreadPool *)0x0)) {
        this = pQVar7;
        QThread::currentThread();
        uVar8 = QThreadPool::contains((QThread *)pQVar7);
        if ((uVar8 & 1) == 0) {
          local_4128 = &DAT_aaaaaaaaaaaaaaaa;
          QSemaphore::QSemaphore((QSemaphore *)&local_4128,0);
          iVar10 = 0;
          for (iVar9 = 0; iVar9 < iVar3; iVar9 = iVar9 + 1) {
            priority = (in_EDI - iVar10) / (iVar3 - iVar9);
            QThreadPool::
            start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4839:5),_true>
                      (this,(anon_class_24_4_b418dff8_for_o *)CONCAT44(iVar10,iVar9),priority);
            iVar10 = priority + iVar10;
          }
          QSemaphore::acquire((int)&local_4128);
          QSemaphore::~QSemaphore((QSemaphore *)&local_4128);
          goto LAB_00b747b4;
        }
      }
      blend_tiled_generic_rgb64::anon_class_40_7_bfeee2df::operator()
                ((anon_class_40_7_bfeee2df *)in_stack_ffffffffffffbe60,in_stack_ffffffffffffbe5c,
                 in_stack_ffffffffffffbe58);
    }
    else {
      while (local_4144 != 0) {
        local_4174 = *local_4150;
        iVar3 = local_4150[2];
        local_40f0 = local_4150[1];
        local_417c = (local_4168 + *local_4150) % local_40ec;
        local_4180 = (local_4150[2] + local_416c) % iVar10;
        if (local_417c < 0) {
          local_417c = local_40ec + local_417c;
        }
        if (local_4180 < 0) {
          local_4180 = iVar10 + local_4180;
        }
        piVar4 = qMin<int>(&local_40ec,&local_40f0);
        local_40f4 = *piVar4;
        if ((0 < local_417c) && (0 < local_40f4)) {
          local_40f8 = local_40ec - local_417c;
          piVar4 = qMin<int>(&local_40f8,&local_40f4);
          iVar9 = *piVar4;
          uVar5 = (*local_4088)(local_4008,local_40c8,in_RDX,local_4180,local_417c,iVar9);
          (*local_4090)(*in_RDX,local_4174,iVar3,uVar5,iVar9);
          local_4174 = iVar9 + local_4174;
          local_417c = iVar9 + local_417c;
          local_40f4 = local_40f4 - iVar9;
          if (local_40ec <= local_417c) {
            local_417c = 0;
          }
        }
        if (0 < local_40f4) {
          uVar5 = (*local_4088)(local_4008,local_40c8,in_RDX,local_4180,local_417c,local_40f4);
          (*local_4090)(*in_RDX,local_4174,iVar3,uVar5,local_40f4);
          local_4174 = local_40f4 + local_4174;
          local_40f4 = 0;
        }
        if (bVar2) {
          puVar6 = QRasterBuffer::scanLine((QRasterBuffer *)*in_RDX,iVar3);
          lVar1 = (long)local_40ec * -8 + (long)local_4174 * 8;
          for (local_41b4 = local_40ec; local_41b4 < local_40f0; local_41b4 = local_41b4 + 1) {
            *(undefined8 *)(puVar6 + (long)local_41b4 * 8 + lVar1) =
                 *(undefined8 *)(puVar6 + (long)(local_41b4 - local_40ec) * 8 + lVar1);
          }
        }
        else {
          puVar6 = QRasterBuffer::scanLine((QRasterBuffer *)*in_RDX,iVar3);
          lVar1 = (long)local_40ec * -4 + (long)local_4174 * 4;
          for (iVar3 = local_40ec; iVar3 < local_40f0; iVar3 = iVar3 + 1) {
            *(undefined4 *)(puVar6 + (long)iVar3 * 4 + lVar1) =
                 *(undefined4 *)(puVar6 + (long)(iVar3 - local_40ec) * 4 + lVar1);
          }
        }
        local_4150 = local_4150 + 4;
        local_4144 = local_4144 + -1;
      }
    }
  }
LAB_00b747b4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void blend_tiled_generic_rgb64(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, spans, count);
    if (!op.func64) {
        qCDebug(lcQtGuiDrawHelper, "blend_tiled_generic_rgb64: unsupported 64-bit blend attempted, falling back to 32-bit");
        return blend_tiled_generic(count, spans, userData);
    }

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    int xoff = -qRound(-data->dx) % image_width;
    int yoff = -qRound(-data->dy) % image_height;

    if (xoff < 0)
        xoff += image_width;
    if (yoff < 0)
        yoff += image_height;

    bool isBpp32 = qPixelLayouts[data->rasterBuffer->format].bpp == QPixelLayout::BPP32;
    bool isBpp64 = qPixelLayouts[data->rasterBuffer->format].bpp == QPixelLayout::BPP64;
    if (op.destFetch64 == destFetch64Undefined && image_width <= BufferSize && (isBpp32 || isBpp64)) {
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 src_buffer[BufferSize];
        // If destination isn't blended into the result, we can do the tiling directly on destination pixels.
        while (count--) {
            int x = spans->x;
            int y = spans->y;
            int length = spans->len;
            int sx = (xoff + spans->x) % image_width;
            int sy = (spans->y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            int sl = qMin(image_width, length);
            if (sx > 0 && sl > 0) {
                int l = qMin(image_width - sx, sl);
                const QRgba64 *src = op.srcFetch64(src_buffer, &op, data, sy, sx, l);
                op.destStore64(data->rasterBuffer, x, y, src, l);
                x += l;
                sx += l;
                sl -= l;
                if (sx >= image_width)
                    sx = 0;
            }
            if (sl > 0) {
                Q_ASSERT(sx == 0);
                const QRgba64 *src = op.srcFetch64(src_buffer, &op, data, sy, sx, sl);
                op.destStore64(data->rasterBuffer, x, y, src, sl);
                x += sl;
                sx += sl;
                sl -= sl;
                if (sx >= image_width)
                    sx = 0;
            }
            if (isBpp32) {
                uint *dest = reinterpret_cast<uint *>(data->rasterBuffer->scanLine(y)) + x - image_width;
                for (int i = image_width; i < length; ++i)
                    dest[i] = dest[i - image_width];
            } else {
                quint64 *dest = reinterpret_cast<quint64 *>(data->rasterBuffer->scanLine(y)) + x - image_width;
                for (int i = image_width; i < length; ++i)
                    dest[i] = dest[i - image_width];
            }
            ++spans;
        }
        return;
    }

    auto function = [=, &op](int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 src_buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = (xoff + spans[c].x) % image_width;
            int sy = (spans[c].y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            const int coverage = (spans[c].coverage * data->texture.const_alpha) >> 8;
            while (length) {
                int l = qMin(image_width - sx, length);
                if (BufferSize < l)
                    l = BufferSize;
                const QRgba64 *src = op.srcFetch64(src_buffer, &op, data, sy, sx, l);
                QRgba64 *dest = op.destFetch64(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.func64(dest, src, l, coverage);
                if (op.destStore64)
                    op.destStore64(data->rasterBuffer, x, spans[c].y, dest, l);
                x += l;
                sx += l;
                length -= l;
                if (sx >= image_width)
                    sx = 0;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}